

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update2_ghosts(Integer g_a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  C_Integer *pCVar6;
  ushort uVar7;
  Integer proc;
  logical lVar8;
  Integer *map;
  ulong *proclist;
  long lVar9;
  long lVar10;
  size_t sVar11;
  Integer IVar12;
  long lVar13;
  ulong uVar14;
  int _d;
  long lVar15;
  long lVar16;
  ushort uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  C_Integer CVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  char *pcVar29;
  int iVar30;
  ulong proc_00;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  int _index [7];
  Integer _hi [7];
  Integer np;
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar8 = pnga_has_ghosts(g_a);
  if (lVar8 != 0) {
    lVar8 = gai_check_ghost_distr(g_a);
    IVar12 = GAnproc;
    if (lVar8 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update2_ghosts:malloc failed (_ga_map)",0);
      IVar12 = GAnproc;
    }
    lVar1 = g_a + 1000;
    proclist = (ulong *)malloc(IVar12 << 3);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update2_ghosts:malloc failed (_ga_proclist)",0);
    }
    iVar2 = GA[lVar1].elemsize;
    lVar18 = (long)GA[lVar1].ndim;
    iVar3 = GA[lVar1].p_handle;
    lVar9 = 0;
    lVar33 = 0;
    if (0 < lVar18) {
      lVar33 = lVar18;
    }
    for (; lVar33 != lVar9; lVar9 = lVar9 + 1) {
      width[lVar9] = GA[g_a + 1000].width[lVar9];
      dims[lVar9] = GA[g_a + 1000].dims[lVar9];
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar9 = 1;
    lVar10 = lVar33;
    while (bVar35 = lVar10 != 0, lVar10 = lVar10 + -1, bVar35) {
      lVar9 = lVar9 * 3;
    }
    lVar18 = lVar18 + -1;
    lVar34 = 0;
    lVar10 = lVar18;
    if (lVar18 < 1) {
      lVar10 = lVar34;
    }
    for (lVar32 = 0; lVar32 != lVar9; lVar32 = lVar32 + 1) {
      lVar31 = lVar32;
      lVar15 = 1;
      for (lVar26 = 0; lVar33 != lVar26; lVar26 = lVar26 + 1) {
        lVar19 = lVar31 % 3 + -1;
        mask[lVar26] = lVar19;
        if (lVar19 != 0) {
          lVar15 = lVar34;
        }
        lVar31 = lVar31 / 3;
      }
      if (lVar15 == 0) {
        lVar31 = 0;
        for (lVar15 = 0; lVar33 != lVar15; lVar15 = lVar15 + 1) {
          if ((mask[lVar15] != 0) && (width[lVar15] == 0)) {
            lVar31 = 1;
          }
        }
        if (lVar31 == 0) {
          for (lVar31 = 0; lVar33 != lVar31; lVar31 = lVar31 + 1) {
            lVar15 = mask[lVar31];
            if (lVar15 == -1) {
              lVar15 = lo_loc[lVar31];
              if (1 < lVar15) {
                tlo_rem[lVar31] = lVar15 - width[lVar31];
                lVar15 = lVar15 + -1;
                goto LAB_00180be0;
              }
              thi_rem[lVar31] = dims[lVar31];
              tlo_rem[lVar31] = (dims[lVar31] - width[lVar31]) + 1;
            }
            else {
              if (lVar15 == 1) {
                lVar15 = hi_loc[lVar31];
                if (lVar15 < dims[lVar31]) {
                  tlo_rem[lVar31] = lVar15 + 1;
                  lVar15 = lVar15 + width[lVar31];
                }
                else {
                  tlo_rem[lVar31] = 1;
                  lVar15 = width[lVar31];
                }
              }
              else {
                if (lVar15 != 0) {
                  fwrite("Illegal mask value found\n",0x19,1,_stderr);
                  goto LAB_00180be8;
                }
                tlo_rem[lVar31] = lo_loc[lVar31];
                lVar15 = hi_loc[lVar31];
              }
LAB_00180be0:
              thi_rem[lVar31] = lVar15;
            }
LAB_00180be8:
          }
          lVar8 = pnga_locate_region(g_a,tlo_rem,thi_rem,map,(Integer *)proclist,&np);
          if (lVar8 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar1].name);
            sVar11 = strlen(err_string);
            sprintf(err_string + (int)sVar11," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
            sVar11 = strlen(err_string);
            lVar31 = 1;
            while( true ) {
              IVar12 = pnga_ndim(g_a);
              pcVar29 = err_string + (int)sVar11;
              if (IVar12 <= lVar31) break;
              sprintf(pcVar29,",%ld:%ld ",tlo_rem[lVar31],thi_rem[lVar31]);
              sVar11 = strlen(err_string);
              lVar31 = lVar31 + 1;
            }
            pcVar29[0] = ']';
            pcVar29[1] = '\0';
            pnga_error(err_string,g_a);
          }
          if (1 < np) {
            fwrite("More than one remote processor found\n",0x25,1,_stderr);
          }
          proc_00 = *proclist;
          pnga_distribution(g_a,proc_00,tlo_rem,thi_rem);
          for (lVar31 = 0; lVar33 != lVar31; lVar31 = lVar31 + 1) {
            lVar15 = mask[lVar31];
            if (lVar15 == -1) {
              lVar15 = width[lVar31];
              plo_loc[lVar31] = lVar15;
              phi_loc[lVar31] = lVar15 * 2 + -1;
              lVar15 = ((lVar15 + thi_rem[lVar31]) - tlo_rem[lVar31]) + 1;
LAB_00180e32:
              plo_rem[lVar31] = lVar15;
            }
            else {
              if (lVar15 == 1) {
                plo_loc[lVar31] = (hi_loc[lVar31] - lo_loc[lVar31]) + 1;
                phi_loc[lVar31] = (hi_loc[lVar31] - lo_loc[lVar31]) + width[lVar31];
                lVar15 = 0;
                goto LAB_00180e32;
              }
              if (lVar15 == 0) {
                lVar15 = width[lVar31];
                plo_loc[lVar31] = lVar15;
                phi_loc[lVar31] = (hi_loc[lVar31] + lVar15) - lo_loc[lVar31];
                goto LAB_00180e32;
              }
            }
          }
          uVar17 = GA[lVar1].ndim;
          lVar31 = (long)(short)uVar17;
          iVar30 = GA[lVar1].distr_type;
          if (iVar30 - 1U < 3) {
            lVar26 = (long)(int)proc % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar26;
            IVar12 = proc;
            lVar15 = 0;
            while (lVar15 + 1 < lVar31) {
              IVar12 = (long)((int)IVar12 - (int)lVar26) / GA[g_a + 1000].num_blocks[lVar15];
              lVar26 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar15 + 1];
              _index[lVar15 + 1] = (int)lVar26;
              lVar15 = lVar15 + 1;
            }
            uVar7 = 0;
            if (0 < (short)uVar17) {
              uVar7 = uVar17;
            }
            for (lVar15 = 0; (ulong)uVar7 * 4 != lVar15; lVar15 = lVar15 + 4) {
              iVar28 = *(int *)((long)_index + lVar15);
              lVar26 = *(long *)((long)GA[g_a + 1000].block_dims + lVar15 * 2);
              *(long *)(err_string + lVar15 * 2) = lVar26 * iVar28 + 1;
              lVar26 = ((long)iVar28 + 1) * lVar26;
              lVar19 = *(long *)((long)GA[g_a + 1000].dims + lVar15 * 2);
              if (lVar19 <= lVar26) {
                lVar26 = lVar19;
              }
              *(long *)((long)_hi + lVar15 * 2) = lVar26;
            }
          }
          else if (iVar30 == 4) {
            lVar26 = (long)(int)proc % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar26;
            IVar12 = proc;
            lVar15 = 0;
            while (lVar15 + 1 < lVar31) {
              IVar12 = (long)((int)IVar12 - (int)lVar26) / GA[g_a + 1000].num_blocks[lVar15];
              lVar26 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar15 + 1];
              _index[lVar15 + 1] = (int)lVar26;
              lVar15 = lVar15 + 1;
            }
            lVar15 = 0;
            uVar7 = 0;
            if (0 < (short)uVar17) {
              uVar7 = uVar17;
            }
            iVar28 = 0;
            for (; (ulong)uVar7 * 4 != lVar15; lVar15 = lVar15 + 4) {
              pCVar6 = GA[lVar1].mapc;
              iVar25 = *(int *)((long)_index + lVar15);
              lVar19 = (long)iVar28 + (long)iVar25;
              *(C_Integer *)(err_string + lVar15 * 2) = pCVar6[lVar19];
              lVar26 = *(long *)((long)GA[lVar1].num_blocks + lVar15 * 2);
              if ((long)iVar25 < lVar26 + -1) {
                lVar19 = pCVar6[lVar19 + 1] + -1;
              }
              else {
                lVar19 = *(long *)((long)GA[lVar1].dims + lVar15 * 2);
              }
              *(long *)((long)_hi + lVar15 * 2) = lVar19;
              iVar28 = iVar28 + (int)lVar26;
            }
          }
          else if (iVar30 == 0) {
            if (GA[lVar1].num_rstrctd == 0) {
              lVar15 = 0;
              if (0 < lVar31) {
                lVar15 = lVar31;
              }
              lVar26 = 1;
              for (lVar19 = 0; lVar15 != lVar19; lVar19 = lVar19 + 1) {
                lVar26 = lVar26 * GA[g_a + 1000].nblock[lVar19];
              }
              if ((proc < 0) || (lVar26 <= proc)) {
                for (lVar26 = 0; lVar15 != lVar26; lVar26 = lVar26 + 1) {
                  hi_loc[lVar26 + -0x20] = 0;
                  _hi[lVar26] = -1;
                }
              }
              else {
                lVar26 = 0;
                IVar12 = proc;
                for (lVar19 = 0; lVar15 != lVar19; lVar19 = lVar19 + 1) {
                  lVar16 = (long)GA[g_a + 1000].nblock[lVar19];
                  lVar13 = IVar12 % lVar16;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar19 + -0x20] = pCVar6[lVar13 + lVar26];
                  if (lVar13 == lVar16 + -1) {
                    CVar23 = GA[g_a + 1000].dims[lVar19];
                  }
                  else {
                    CVar23 = pCVar6[lVar13 + lVar26 + 1] + -1;
                  }
                  lVar26 = lVar26 + lVar16;
                  _hi[lVar19] = CVar23;
                  IVar12 = IVar12 / lVar16;
                }
              }
            }
            else if (proc < GA[lVar1].num_rstrctd) {
              lVar15 = 0;
              if (0 < lVar31) {
                lVar15 = lVar31;
              }
              lVar26 = 1;
              for (lVar19 = 0; lVar15 != lVar19; lVar19 = lVar19 + 1) {
                lVar26 = lVar26 * GA[g_a + 1000].nblock[lVar19];
              }
              if ((proc < 0) || (lVar26 <= proc)) {
                for (lVar26 = 0; lVar15 != lVar26; lVar26 = lVar26 + 1) {
                  hi_loc[lVar26 + -0x20] = 0;
                  _hi[lVar26] = -1;
                }
              }
              else {
                lVar19 = 0;
                IVar12 = proc;
                for (lVar26 = 0; lVar15 != lVar26; lVar26 = lVar26 + 1) {
                  lVar16 = (long)GA[g_a + 1000].nblock[lVar26];
                  lVar13 = IVar12 % lVar16;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar26 + -0x20] = pCVar6[lVar13 + lVar19];
                  if (lVar13 == lVar16 + -1) {
                    CVar23 = GA[g_a + 1000].dims[lVar26];
                  }
                  else {
                    CVar23 = pCVar6[lVar13 + lVar19 + 1] + -1;
                  }
                  lVar19 = lVar19 + lVar16;
                  _hi[lVar26] = CVar23;
                  IVar12 = IVar12 / lVar16;
                }
              }
            }
            else {
              iVar28 = 0;
              if (0 < (short)uVar17) {
                iVar28 = (int)(short)uVar17;
              }
              for (lVar15 = 0; iVar28 != lVar15; lVar15 = lVar15 + 1) {
                hi_loc[lVar15 + -0x20] = 0;
                _hi[lVar15] = -1;
              }
            }
          }
          lVar15 = lVar31 + -1;
          if (lVar15 == 0) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
          }
          lVar26 = 0;
          if (0 < lVar15) {
            lVar26 = lVar15;
          }
          lVar13 = 0;
          lVar19 = 1;
          for (lVar16 = 0; lVar26 != lVar16; lVar16 = lVar16 + 1) {
            lVar13 = lVar13 + plo_loc[lVar16] * lVar19;
            lVar20 = (_hi[lVar16] - hi_loc[lVar16 + -0x20]) + GA[g_a + 1000].width[lVar16] * 2 + 1;
            ld_loc[lVar16] = lVar20;
            lVar19 = lVar19 * lVar20;
          }
          lVar16 = *(long *)(stride_loc + lVar31 * 2 + 6);
          ppcVar4 = GA[lVar1].ptr;
          iVar28 = GA[lVar1].elemsize;
          pcVar29 = ppcVar4[proc];
          if (iVar30 - 1U < 3) {
            lVar21 = (long)(int)proc_00 % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar21;
            uVar14 = proc_00;
            lVar20 = 0;
            while (lVar20 + 1 < lVar31) {
              uVar14 = (long)((int)uVar14 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
              lVar21 = (long)(int)uVar14 % GA[g_a + 1000].num_blocks[lVar20 + 1];
              _index[lVar20 + 1] = (int)lVar21;
              lVar20 = lVar20 + 1;
            }
            uVar7 = 0;
            if (0 < (short)uVar17) {
              uVar7 = uVar17;
            }
            for (lVar20 = 0; (ulong)uVar7 * 4 != lVar20; lVar20 = lVar20 + 4) {
              iVar30 = *(int *)((long)_index + lVar20);
              lVar21 = *(long *)((long)GA[g_a + 1000].block_dims + lVar20 * 2);
              *(long *)(err_string + lVar20 * 2) = lVar21 * iVar30 + 1;
              lVar21 = ((long)iVar30 + 1) * lVar21;
              lVar27 = *(long *)((long)GA[g_a + 1000].dims + lVar20 * 2);
              if (lVar27 <= lVar21) {
                lVar21 = lVar27;
              }
              *(long *)((long)_hi + lVar20 * 2) = lVar21;
            }
          }
          else if (iVar30 == 4) {
            lVar21 = (long)(int)proc_00 % GA[lVar1].num_blocks[0];
            _index[0] = (int)lVar21;
            uVar14 = proc_00;
            lVar20 = 0;
            while (lVar20 + 1 < lVar31) {
              uVar14 = (long)((int)uVar14 - (int)lVar21) / GA[g_a + 1000].num_blocks[lVar20];
              lVar21 = (long)(int)uVar14 % GA[g_a + 1000].num_blocks[lVar20 + 1];
              _index[lVar20 + 1] = (int)lVar21;
              lVar20 = lVar20 + 1;
            }
            lVar20 = 0;
            if ((short)uVar17 < 1) {
              uVar17 = 0;
            }
            iVar30 = 0;
            for (; (ulong)uVar17 * 4 != lVar20; lVar20 = lVar20 + 4) {
              pCVar6 = GA[lVar1].mapc;
              iVar25 = *(int *)((long)_index + lVar20);
              lVar27 = (long)iVar30 + (long)iVar25;
              *(C_Integer *)(err_string + lVar20 * 2) = pCVar6[lVar27];
              lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2);
              if ((long)iVar25 < lVar21 + -1) {
                lVar27 = pCVar6[lVar27 + 1] + -1;
              }
              else {
                lVar27 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
              }
              *(long *)((long)_hi + lVar20 * 2) = lVar27;
              iVar30 = iVar30 + (int)lVar21;
            }
          }
          else if (iVar30 == 0) {
            if (GA[lVar1].num_rstrctd == 0) {
              lVar20 = lVar31;
              if (lVar31 < 1) {
                lVar20 = lVar34;
              }
              lVar21 = 1;
              for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
                lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar27];
              }
              if (((long)proc_00 < 0) || (lVar21 <= (long)proc_00)) {
                for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                  hi_loc[lVar21 + -0x20] = 0;
                  _hi[lVar21] = -1;
                }
              }
              else {
                lVar21 = 0;
                uVar14 = proc_00;
                for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
                  lVar24 = (long)GA[g_a + 1000].nblock[lVar27];
                  lVar22 = (long)uVar14 % lVar24;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar27 + -0x20] = pCVar6[lVar22 + lVar21];
                  if (lVar22 == lVar24 + -1) {
                    CVar23 = GA[g_a + 1000].dims[lVar27];
                  }
                  else {
                    CVar23 = pCVar6[lVar22 + lVar21 + 1] + -1;
                  }
                  lVar21 = lVar21 + lVar24;
                  _hi[lVar27] = CVar23;
                  uVar14 = (long)uVar14 / lVar24;
                }
              }
            }
            else if ((long)proc_00 < GA[lVar1].num_rstrctd) {
              lVar20 = lVar31;
              if (lVar31 < 1) {
                lVar20 = lVar34;
              }
              lVar21 = 1;
              for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
                lVar21 = lVar21 * GA[g_a + 1000].nblock[lVar27];
              }
              if (((long)proc_00 < 0) || (lVar21 <= (long)proc_00)) {
                for (lVar21 = 0; lVar20 != lVar21; lVar21 = lVar21 + 1) {
                  hi_loc[lVar21 + -0x20] = 0;
                  _hi[lVar21] = -1;
                }
              }
              else {
                lVar21 = 0;
                uVar14 = proc_00;
                for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
                  lVar24 = (long)GA[g_a + 1000].nblock[lVar27];
                  lVar22 = (long)uVar14 % lVar24;
                  pCVar6 = GA[lVar1].mapc;
                  hi_loc[lVar27 + -0x20] = pCVar6[lVar22 + lVar21];
                  if (lVar22 == lVar24 + -1) {
                    CVar23 = GA[g_a + 1000].dims[lVar27];
                  }
                  else {
                    CVar23 = pCVar6[lVar22 + lVar21 + 1] + -1;
                  }
                  lVar21 = lVar21 + lVar24;
                  _hi[lVar27] = CVar23;
                  uVar14 = (long)uVar14 / lVar24;
                }
              }
            }
            else {
              iVar30 = 0;
              if (0 < (short)uVar17) {
                iVar30 = (int)(short)uVar17;
              }
              for (lVar20 = 0; iVar30 != lVar20; lVar20 = lVar20 + 1) {
                hi_loc[lVar20 + -0x20] = 0;
                _hi[lVar20] = -1;
              }
            }
          }
          if (lVar15 == 0) {
            ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
          }
          lVar15 = 1;
          lVar20 = 0;
          for (lVar21 = 0; lVar26 != lVar21; lVar21 = lVar21 + 1) {
            lVar20 = lVar20 + plo_rem[lVar21] * lVar15;
            lVar27 = (_hi[lVar21] - hi_loc[lVar21 + -0x20]) + GA[g_a + 1000].width[lVar21] * 2 + 1;
            ld_rem[lVar21] = lVar27;
            lVar15 = lVar15 * lVar27;
          }
          lVar31 = plo_rem[lVar31 + -1];
          pcVar5 = ppcVar4[proc_00];
          stride_loc[0] = iVar2;
          stride_rem[0] = iVar2;
          iVar30 = iVar2;
          iVar25 = iVar2;
          for (lVar26 = 0; lVar10 << 2 != lVar26; lVar26 = lVar26 + 4) {
            iVar30 = iVar30 * *(int *)((long)ld_rem + lVar26 * 2);
            *(int *)((long)stride_rem + lVar26) = iVar30;
            iVar25 = iVar25 * *(int *)((long)ld_loc + lVar26 * 2);
            *(int *)((long)stride_loc + lVar26) = iVar25;
            *(int *)((long)stride_rem + lVar26 + 4) = iVar30;
            *(int *)((long)stride_loc + lVar26 + 4) = iVar25;
          }
          for (lVar26 = 0; lVar33 != lVar26; lVar26 = lVar26 + 1) {
            count[lVar26] = ((int)phi_loc[lVar26] - (int)plo_loc[lVar26]) + 1;
          }
          count[0] = count[0] * iVar2;
          if (-1 < iVar3) {
            proc_00 = (ulong)(uint)PGRP_LIST[iVar3].inv_map_proc_list[proc_00];
          }
          ARMCI_NbPutS(pcVar29 + (lVar19 * lVar16 + lVar13) * (long)iVar28,stride_loc,
                       pcVar5 + (lVar15 * lVar31 + lVar20) * (long)iVar28,stride_rem,count,
                       (int)lVar18,(int)proc_00,(armci_hdl_t *)0x0);
        }
      }
    }
    ARMCI_WaitAll();
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update2_ghosts(Integer g_a)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  /*Integer tlo_loc[MAXDIM], thi_loc[MAXDIM];*/
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return TRUE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update2_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update2_ghosts:malloc failed (_ga_proclist)",0);
  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of PUT operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all PUT operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    /*if (itmp>1) mask0 = TRUE; */
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor to which it is going. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        /*tlo_loc[idx] = lo_loc[idx];*/
        /*thi_loc[idx] = hi_loc[idx];*/
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        /*tlo_loc[idx] = lo_loc[idx];*/
        /*thi_loc[idx] = lo_loc[idx]+width[idx]-1;*/
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        /*tlo_loc[idx] = hi_loc[idx]-width[idx]+1;*/
        /*thi_loc[idx] = hi_loc[idx];*/
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to send
       data to it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = 2*width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = 0;
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* put data on remote processor */
    /*ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);*/
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_NbPutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem, NULL); 
  }

  ARMCI_WaitAll();
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}